

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_hlcv.c
# Opt level: O2

ErrorNumber test_func_per_hlcv(TA_History *history)

{
  double dVar1;
  TA_TestId TVar2;
  TA_RetCode TVar3;
  ErrorNumber EVar4;
  ulong uVar5;
  int iVar6;
  TA_FuncUnstId unstId;
  int iVar7;
  TA_FuncUnstId integerTolerance;
  TA_Real *pTVar8;
  TA_Test_conflict8 *pTVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict8 *local_58;
  TA_Real *local_50;
  TA_Real *pTStack_48;
  TA_Real *local_40;
  TA_Real *pTStack_38;
  
  pTVar9 = tableTest;
  uVar5 = 0;
  do {
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    if (uVar5 == 0x18) {
      return TA_TEST_PASS;
    }
    if ((int)history->nbBars < pTVar9->expectedNbElement) {
      printf("Failed Bad Parameter for Test #%d (%d,%d)\n",uVar5 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    TVar3 = TA_SetUnstablePeriod(TA_FUNC_UNST_MFI,0);
    if (TVar3 != TA_SUCCESS) {
      uVar10 = 0x8a;
      goto LAB_00119bb9;
    }
    switch(pTVar9->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar9->optInTimePeriod,&outBegIdx,&outNbElement,
                     gBuffer[0].out0);
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_0011940a;
    case TA_ADOSC_5_2_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_0011940a:
      TVar3 = TA_ADOSC(iVar7,iVar6,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar8,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    default:
      TVar3 = 0x140d;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar4 != TA_TEST_PASS))
       || (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
          EVar4 != TA_TEST_PASS)) goto LAB_00119b0c;
    EVar4 = checkExpectedValue(gBuffer[0].out0,TVar3,pTVar9->expectedRetCode,outBegIdx,
                               pTVar9->expectedBegIdx,outNbElement,pTVar9->expectedNbElement,
                               pTVar9->oneOfTheExpectedOutReal0,
                               pTVar9->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119b14;
    outNbElement = 0;
    outBegIdx = 0;
    switch(pTVar9->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar9->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].in)
      ;
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_0011959d;
    case TA_ADOSC_5_2_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_0011959d:
      TVar3 = TA_ADOSC(iVar7,iVar6,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar8,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[0].in);
      break;
    default:
      TVar3 = 0x140e;
    }
    EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars), EVar4 != TA_TEST_PASS)
        ) || (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[0].in), EVar4 != TA_TEST_PASS))
    goto LAB_00119b0c;
    EVar4 = checkExpectedValue(gBuffer[0].in,TVar3,pTVar9->expectedRetCode,outBegIdx,
                               pTVar9->expectedBegIdx,outNbElement,pTVar9->expectedNbElement,
                               pTVar9->oneOfTheExpectedOutReal0,
                               pTVar9->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119b14;
    setInputBuffer(0,history->high,history->nbBars);
    switch(pTVar9->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar9->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[1].in)
      ;
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_0011972d;
    case TA_ADOSC_5_2_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_0011972d:
      TVar3 = TA_ADOSC(iVar7,iVar6,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar8,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[1].in);
      break;
    default:
      TVar3 = 0x140f;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[2].in,history->close,history->nbBars), EVar4 != TA_TEST_PASS)
        ) || (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[1].in), EVar4 != TA_TEST_PASS))
    goto LAB_00119b0c;
    EVar4 = checkExpectedValue(gBuffer[1].in,TVar3,pTVar9->expectedRetCode,outBegIdx,
                               pTVar9->expectedBegIdx,outNbElement,pTVar9->expectedNbElement,
                               pTVar9->oneOfTheExpectedOutReal0,
                               pTVar9->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) goto LAB_00119b14;
    setInputBuffer(1,history->low,history->nbBars);
    switch(pTVar9->theFunction) {
    case TA_ANY_MA_TEST:
      TVar3 = TA_MFI(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     history->volume,pTVar9->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[2].in)
      ;
      break;
    case TA_AD_TEST:
      TVar3 = TA_AD(pTVar9->startIdx,pTVar9->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    history->volume,&outBegIdx,&outNbElement,gBuffer[2].in);
      break;
    case TA_ADOSC_3_10_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 10;
      iVar11 = 3;
      goto LAB_001198c2;
    case TA_ADOSC_5_2_TEST:
      iVar7 = pTVar9->startIdx;
      iVar6 = pTVar9->endIdx;
      pTVar8 = history->volume;
      iVar12 = 2;
      iVar11 = 5;
LAB_001198c2:
      TVar3 = TA_ADOSC(iVar7,iVar6,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,pTVar8,iVar11,iVar12,
                       &outBegIdx,&outNbElement,gBuffer[2].in);
      break;
    default:
      TVar3 = 0x1410;
    }
    EVar4 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar4 != TA_TEST_PASS) ||
        (EVar4 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar4 != TA_TEST_PASS))
       || (EVar4 = checkSameContent(gBuffer[0].out0,gBuffer[2].in), EVar4 != TA_TEST_PASS)) {
LAB_00119b0c:
      uVar10 = (ulong)EVar4;
      goto LAB_00119bb9;
    }
    EVar4 = checkExpectedValue(gBuffer[2].in,TVar3,pTVar9->expectedRetCode,outBegIdx,
                               pTVar9->expectedBegIdx,outNbElement,pTVar9->expectedNbElement,
                               pTVar9->oneOfTheExpectedOutReal0,
                               pTVar9->oneOfTheExpectedOutRealIndex0);
    if (EVar4 != TA_TEST_PASS) {
LAB_00119b14:
      printf("Fail for output id=%d\n",0);
      uVar10 = (ulong)EVar4;
      goto LAB_00119bb9;
    }
    setInputBuffer(2,history->close,history->nbBars);
    if (pTVar9->doRangeTestFlag == 0) {
LAB_00119a32:
      pTVar8 = gBuffer[0].out0;
      if (pTVar9->theFunction == TA_AD_TEST) {
        *gBuffer[0].out0 = -1.0;
        pTVar8[1] = -1.0;
        TVar3 = TA_AD(0,0,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,history->volume,&outBegIdx,
                      &outNbElement,pTVar8);
        if (TVar3 != TA_SUCCESS) {
          printf("Failed AD call for fix #1359452 [%d]\n",(ulong)TVar3);
          uVar10 = 2000;
LAB_00119bb9:
          printf("Failed Test #%d (Code=%d)\n",uVar5 & 0xffffffff,uVar10);
          return (ErrorNumber)uVar10;
        }
        if ((*gBuffer[0].out0 == -1.0) && (!NAN(*gBuffer[0].out0))) {
          puts("Failed AD call for fix #1359452 out0[0] == -1");
          uVar10 = 0x7d1;
          goto LAB_00119bb9;
        }
        TVar3 = TA_AD(1,1,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,history->volume,&outBegIdx,
                      &outNbElement,gBuffer[0].out0 + 1);
        if (TVar3 != TA_SUCCESS) {
          printf("Failed AD call for fix #1359452 [%d]\n",(ulong)TVar3);
          uVar10 = 0x7d3;
          goto LAB_00119bb9;
        }
        dVar1 = gBuffer[0].out0[1];
        if ((dVar1 == -1.0) && (!NAN(dVar1))) {
          puts("Failed AD call for fix #1359452 out0[1] == -1");
          uVar10 = 0x7d4;
          goto LAB_00119bb9;
        }
        if ((dVar1 == *gBuffer[0].out0) && (!NAN(dVar1) && !NAN(*gBuffer[0].out0))) {
          puts("Failed AD logic for fix #1359452");
          uVar10 = 0x7d5;
          goto LAB_00119bb9;
        }
      }
    }
    else {
      local_50 = history->high;
      pTStack_48 = history->low;
      local_40 = history->close;
      pTStack_38 = history->volume;
      TVar2 = pTVar9->theFunction;
      local_58 = pTVar9;
      if (TVar2 - TA_ADOSC_3_10_TEST < 2) {
        unstId = TA_FUNC_UNST_EMA;
        integerTolerance = TA_FUNC_UNST_NONE;
LAB_00119a25:
        EVar4 = doRangeTest(rangeTestFunction,unstId,&local_58,1,integerTolerance);
        if (EVar4 != TA_TEST_PASS) goto LAB_00119b0c;
        goto LAB_00119a32;
      }
      if (TVar2 == TA_AD_TEST) {
        integerTolerance = TA_FUNC_UNST_NONE;
        unstId = integerTolerance;
        goto LAB_00119a25;
      }
      if (TVar2 == TA_ANY_MA_TEST) {
        integerTolerance = TA_FUNC_UNST_ADX;
        unstId = TA_FUNC_UNST_MFI;
        goto LAB_00119a25;
      }
    }
    uVar5 = uVar5 + 1;
    pTVar9 = pTVar9 + 1;
  } while( true );
}

Assistant:

ErrorNumber test_func_per_hlcv( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;


   for( i=0; i < NB_TEST; i++ )
   {
      /* Re-initialize all the unstable period to zero. */
      TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}